

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_Integer lua_tointegerx(lua_State *L,int idx,int *ok)

{
  int iVar1;
  TValue *pTVar2;
  undefined4 *in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  lua_Number n;
  TValue tmp;
  cTValue *o;
  TValue *in_stack_ffffffffffffffc8;
  GCstr *in_stack_ffffffffffffffd0;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  if ((pTVar2->field_2).it < 0xfffeffff) {
    in_stack_ffffffffffffffd0 = (GCstr *)pTVar2->n;
  }
  else if (((pTVar2->field_2).it != 0xfffffffb) ||
          (iVar1 = lj_strscan_num(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), iVar1 == 0))
  {
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = 0;
    }
    return 0;
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 1;
  }
  return (long)(double)in_stack_ffffffffffffffd0;
}

Assistant:

LUA_API lua_Integer lua_tointegerx(lua_State *L, int idx, int *ok)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  lua_Number n;
  if (LJ_LIKELY(tvisint(o))) {
    if (ok) *ok = 1;
    return intV(o);
  } else if (LJ_LIKELY(tvisnum(o))) {
    n = numV(o);
  } else {
    if (!(tvisstr(o) && lj_strscan_number(strV(o), &tmp))) {
      if (ok) *ok = 0;
      return 0;
    }
    if (tvisint(&tmp)) {
      if (ok) *ok = 1;
      return intV(&tmp);
    }
    n = numV(&tmp);
  }
  if (ok) *ok = 1;
#if LJ_64
  return (lua_Integer)n;
#else
  return lj_num2int(n);
#endif
}